

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorProto::InternalSwap
          (FileDescriptorProto *this,FileDescriptorProto *other)

{
  uint32 uVar1;
  int iVar2;
  string *psVar3;
  FileOptions *pFVar4;
  SourceCodeInfo *pSVar5;
  void *pvVar6;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar7;
  void *pvVar8;
  UnknownFieldSet *pUVar9;
  UnknownFieldSet *pUVar10;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->dependency_).super_RepeatedPtrFieldBase,
             &(other->dependency_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->message_type_).super_RepeatedPtrFieldBase,
             &(other->message_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             &(other->enum_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->service_).super_RepeatedPtrFieldBase,
             &(other->service_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->extension_).super_RepeatedPtrFieldBase,
             &(other->extension_).super_RepeatedPtrFieldBase);
  RepeatedField<int>::InternalSwap(&this->public_dependency_,&other->public_dependency_);
  RepeatedField<int>::InternalSwap(&this->weak_dependency_,&other->weak_dependency_);
  psVar3 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar3;
  psVar3 = (this->package_).ptr_;
  (this->package_).ptr_ = (other->package_).ptr_;
  (other->package_).ptr_ = psVar3;
  psVar3 = (this->syntax_).ptr_;
  (this->syntax_).ptr_ = (other->syntax_).ptr_;
  (other->syntax_).ptr_ = psVar3;
  pFVar4 = this->options_;
  this->options_ = other->options_;
  other->options_ = pFVar4;
  pSVar5 = this->source_code_info_;
  this->source_code_info_ = other->source_code_info_;
  other->source_code_info_ = pSVar5;
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pvVar8 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  pvVar6 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar8 & 1) == 0) {
    if (((ulong)pvVar6 & 1) == 0) goto LAB_0058c285;
LAB_0058c26d:
    pUVar10 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar6 & 1) != 0) goto LAB_0058c26d;
    pUVar10 = internal::
              InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ::mutable_unknown_fields_slow
                        (&(other->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        );
    pvVar8 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
  }
  if (((ulong)pvVar8 & 1) == 0) {
    pUVar9 = internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
  }
  else {
    pUVar9 = (UnknownFieldSet *)((ulong)pvVar8 & 0xfffffffffffffffe);
  }
  pvVar7 = pUVar9->fields_;
  pUVar9->fields_ = pUVar10->fields_;
  pUVar10->fields_ = pvVar7;
LAB_0058c285:
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void FileDescriptorProto::InternalSwap(FileDescriptorProto* other) {
  dependency_.InternalSwap(&other->dependency_);
  message_type_.InternalSwap(&other->message_type_);
  enum_type_.InternalSwap(&other->enum_type_);
  service_.InternalSwap(&other->service_);
  extension_.InternalSwap(&other->extension_);
  public_dependency_.InternalSwap(&other->public_dependency_);
  weak_dependency_.InternalSwap(&other->weak_dependency_);
  name_.Swap(&other->name_);
  package_.Swap(&other->package_);
  syntax_.Swap(&other->syntax_);
  std::swap(options_, other->options_);
  std::swap(source_code_info_, other->source_code_info_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}